

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O1

int32 mkvmuxer::SerializeFloat(IMkvWriter *writer,float f)

{
  int iVar1;
  int32 iVar2;
  int32 bit_count;
  int iVar3;
  uint8 byte;
  undefined1 local_29;
  
  if (writer == (IMkvWriter *)0x0) {
    iVar2 = -1;
  }
  else {
    iVar3 = 0x18;
    do {
      local_29 = (undefined1)((uint)f >> ((byte)iVar3 & 0x1f));
      iVar1 = (**writer->_vptr_IMkvWriter)(writer,&local_29,1);
      if (iVar1 < 0) {
        return iVar1;
      }
      iVar3 = iVar3 + -8;
    } while (iVar3 != -8);
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int32 SerializeFloat(IMkvWriter* writer, float f) {
  if (!writer)
    return -1;

  assert(sizeof(uint32) == sizeof(float));
  // This union is merely used to avoid a reinterpret_cast from float& to
  // uint32& which will result in violation of strict aliasing.
  union U32 {
    uint32 u32;
    float f;
  } value;
  value.f = f;

  for (int32 i = 1; i <= 4; ++i) {
    const int32 byte_count = 4 - i;
    const int32 bit_count = byte_count * 8;

    const uint8 byte = static_cast<uint8>(value.u32 >> bit_count);

    const int32 status = writer->Write(&byte, 1);

    if (status < 0)
      return status;
  }

  return 0;
}